

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

void * ply_grow_array(p_ply ply,void **pointer,long *nmemb,long size)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  size_t __size;
  
  lVar2 = *nmemb;
  lVar1 = lVar2 + 1;
  __size = lVar1 * size;
  if (*pointer == (void *)0x0) {
    pvVar3 = malloc(__size);
  }
  else {
    pvVar3 = realloc(*pointer,__size);
  }
  if (pvVar3 == (void *)0x0) {
    pvVar3 = (void *)0x0;
    ply_ferror(ply,"Out of memory");
  }
  else {
    *pointer = pvVar3;
    *nmemb = lVar1;
    pvVar3 = (void *)(lVar2 * size + (long)pvVar3);
  }
  return pvVar3;
}

Assistant:

static void *ply_grow_array(p_ply ply, void **pointer,
        long *nmemb, long size) {
    void *temp = *pointer;
    long count = *nmemb + 1;
    if (!temp) temp = malloc(count*size);
    else temp = realloc(temp, count*size);
    if (!temp) {
        ply_ferror(ply, "Out of memory");
        return NULL;
    }
    *pointer = temp;
    *nmemb = count;
    return (char *) temp + (count-1) * size;
}